

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint32 drwav_get_bytes_per_sample(drwav *pWav)

{
  drwav_uint32 bytesPerSample;
  drwav *pWav_local;
  
  bytesPerSample = (int)(uint)pWav->bitsPerSample >> 3;
  if ((bytesPerSample == 0) || ((pWav->bitsPerSample & 7) != 0)) {
    bytesPerSample =
         (drwav_uint32)
         ((ulong)(pWav->fmt).blockAlign / (ulong)(long)(int)(uint)(pWav->fmt).channels);
  }
  return bytesPerSample;
}

Assistant:

static drwav_uint32 drwav_get_bytes_per_sample(drwav* pWav)
{
    // The number of bytes per sample is based on the bits per sample or the block align. We prioritize floor(bitsPerSample/8), but if
    // this is zero or the bits per sample is not a multiple of 8 we need to fall back to the block align.
    drwav_uint32 bytesPerSample = pWav->bitsPerSample >> 3;
    if (bytesPerSample == 0 || (pWav->bitsPerSample & 0x7) != 0) {
        bytesPerSample = pWav->fmt.blockAlign/pWav->fmt.channels;
    }

    return bytesPerSample;
}